

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderMBlurSAH<8,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>::
buildMultiSegment(BVHNBuilderMBlurSAH<8,_embree::TriangleMesh,_embree::TriangleMvMB<4>_> *this,
                 size_t numPrimitives)

{
  undefined8 uVar1;
  long lVar2;
  BVH *pBVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  mvector<PrimRefMB> local_180;
  undefined8 local_158;
  undefined8 uStack_150;
  long lStack_148;
  ulong uStack_140;
  ulong local_138;
  undefined4 local_130;
  float fStack_12c;
  undefined1 local_128;
  size_t local_120;
  undefined **local_118;
  Scene *local_110;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<8>_> root;
  
  lVar6 = *(long *)&(this->scene->super_AccelN).field_0x188;
  local_180.alloc.device = (MemoryMonitorInterface *)(lVar6 + 0x550);
  if (lVar6 == 0) {
    local_180.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_180.alloc.hugepages = false;
  local_180.size_active = 0;
  local_180.size_alloced = 0;
  local_180.items = (PrimRefMB *)0x0;
  if (numPrimitives != 0) {
    uVar5 = numPrimitives * 0x50;
    (**(local_180.alloc.device)->_vptr_MemoryMonitorInterface)(local_180.alloc.device,uVar5,0);
    if (uVar5 < 0x1c00000) {
      local_180.items = (PrimRefMB *)alignedMalloc(uVar5,0x10);
      local_180.size_alloced = numPrimitives;
    }
    else {
      local_180.items = (PrimRefMB *)os_malloc(uVar5,&local_180.alloc.hugepages);
      local_180.size_alloced = numPrimitives;
    }
  }
  local_180.size_active = local_180.size_alloced;
  createPrimRefArrayMSMBlur
            (&pinfo,this->scene,this->gtype_,numPrimitives,&local_180,
             &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
             (BBox1f)0x3f80000000000000);
  if (pinfo.object_range._end == pinfo.object_range._begin) {
    (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  }
  else {
    dVar4 = (double)(pinfo.num_time_segments + 3 >> 2) * 1.2 * 320.0;
    uVar5 = (ulong)dVar4;
    sVar7 = ((long)(dVar4 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) +
            (pinfo.num_time_segments * 0x1c0 >> 5);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar7);
    local_120 = 0x400;
    local_158 = 8;
    uStack_150 = 0x50;
    lStack_148 = 0x3f;
    if (this->sahBlockSize != 0) {
      for (; this->sahBlockSize >> lStack_148 == 0; lStack_148 = lStack_148 + -1) {
      }
    }
    local_138 = this->maxLeafSize;
    uStack_140 = this->minLeafSize;
    if (local_138 <= this->minLeafSize) {
      uStack_140 = local_138;
    }
    auVar8._8_4_ = 0x3f800000;
    auVar8._0_8_ = &DAT_3f8000003f800000;
    auVar8._12_4_ = 0x3f800000;
    uVar1 = vmovlps_avx(auVar8);
    _local_130 = CONCAT44(this->intCost,(int)uVar1);
    local_128 = 1;
    local_120 = FastAllocator::fixSingleThreadThreshold
                          (&this->bvh->alloc,8,0x400,
                           pinfo.object_range._end - pinfo.object_range._begin,sVar7);
    lVar2 = *(long *)&(this->scene->super_AccelN).field_0x188;
    lVar6 = lVar2 + 0x550;
    if (lVar2 == 0) {
      lVar6 = 0;
    }
    pBVar3 = this->bvh;
    local_118 = &PTR_operator___02202970;
    local_110 = (pBVar3->scene->progressInterface).scene;
    BVHBuilderMSMBlur::
    build<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::TriangleMesh>,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::TriangleMesh,embree::TriangleMvMB<4>>,embree::Scene::BuildProgressMonitorInterface>
              (&root,(BVHBuilderMSMBlur *)&local_180,&pinfo,lVar6,this->scene,&pBVar3->alloc,pBVar3,
               &local_118,&local_158);
    BVHN<8>::set(this->bvh,(NodeRef)root.ref.ptr,&root.lbounds,pinfo.num_time_segments);
  }
  sVar7 = local_180.size_alloced;
  if (local_180.items != (PrimRefMB *)0x0) {
    if (local_180.size_alloced * 0x50 < 0x1c00000) {
      alignedFree(local_180.items);
    }
    else {
      os_free(local_180.items,local_180.size_alloced * 0x50,local_180.alloc.hugepages);
    }
  }
  if (sVar7 != 0) {
    (**(local_180.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_180.alloc.device,sVar7 * -0x50,1);
  }
  return;
}

Assistant:

void buildMultiSegment(size_t numPrimitives)
      {
        /* create primref array */
        mvector<PrimRefMB> prims(scene->device,numPrimitives);
	PrimInfoMB pinfo = createPrimRefArrayMSMBlur(scene,gtype_,numPrimitives,prims,bvh->scene->progressInterface);

        /* early out if no valid primitives */
        if (pinfo.size() == 0) { bvh->clear(); return; }

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(AABBNodeMB)/(4*N);
        const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.num_time_segments)*sizeof(Primitive));
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);

        /* settings for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(sahBlockSize);
        settings.minLeafSize = min(minLeafSize,maxLeafSize);
        settings.maxLeafSize = maxLeafSize;
        settings.travCost = travCost;
        settings.intCost = intCost;
        settings.singleLeafTimeSegment = Primitive::singleTimeSegment;
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);
        
        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(prims,pinfo,scene->device,
                                            RecalculatePrimRef<Mesh>(scene),
                                            typename BVH::CreateAlloc(bvh),
                                            typename BVH::AABBNodeMB4D::Create(),
                                            typename BVH::AABBNodeMB4D::Set(),
                                            CreateMSMBlurLeaf<N,Mesh,Primitive>(bvh),
                                            bvh->scene->progressInterface,
                                            settings);

        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }